

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  string *__return_storage_ptr__;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  string local_130;
  undefined1 local_110 [8];
  string extraFlags;
  undefined1 local_d0 [8];
  string linkRuleVar;
  undefined1 local_90 [8];
  string linkLanguage;
  string local_68;
  string local_38;
  undefined1 local_11;
  cmMakefileLibraryTargetGenerator *pcStack_10;
  bool requiresDeviceLinking;
  cmMakefileLibraryTargetGenerator *this_local;
  
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcStack_10 = this;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_38,&this->super_cmMakefileTargetGenerator);
  bVar3 = requireDeviceLinking(pcVar1,(cmLocalGenerator *)pcVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_11 = bVar3;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
               (allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
    WriteDeviceLibraryRules(this,&local_68,false);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  __return_storage_ptr__ = (string *)((long)&linkRuleVar.field_2 + 8);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (__return_storage_ptr__,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_90,pcVar1,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&extraFlags.field_2 + 8),&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)local_d0,pcVar1,(string *)local_90,(string *)((long)&extraFlags.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)(extraFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_110);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_130,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)pcVar2,(string *)local_110,&local_130,(string *)local_90,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_130);
  WriteLibraryRules(this,(string *)local_d0,(string *)local_110,false);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
  if (requiresDeviceLinking) {
    this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->GetConfigName());

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, this->GetConfigName(), linkLanguage, this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}